

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O0

int __thiscall
QNetworkAccessFileBackend::open(QNetworkAccessFileBackend *this,char *__file,int __oflag,...)

{
  QLatin1StringView latin1;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  Operation OVar6;
  QIODevice *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QLatin1StringView QVar9;
  bool opened;
  QString msg;
  OpenMode mode;
  QString fileName;
  QUrl url;
  undefined4 in_stack_fffffffffffffd48;
  ComponentFormattingOption in_stack_fffffffffffffd4c;
  enum_type in_stack_fffffffffffffd50;
  enum_type in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5c;
  byte in_stack_fffffffffffffd5d;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  int fieldWidth;
  undefined7 in_stack_fffffffffffffd68;
  code *in_stack_fffffffffffffd70;
  QString *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  uint uVar10;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd9c;
  QChar fillChar;
  QNetworkAccessFileBackend *slot;
  ContextType *in_stack_fffffffffffffda8;
  Object *in_stack_fffffffffffffdb0;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_23c;
  QUrl local_238;
  offset_in_QIODevice_to_subr in_stack_fffffffffffffdd0;
  char local_218 [8];
  ConnectionType in_stack_fffffffffffffdf0;
  Connection local_1e0;
  Int local_1d4;
  Connection local_1d0;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_1c8;
  Int local_1c4;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_1c0;
  int local_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [30];
  undefined2 local_17a;
  QLatin1StringView local_140;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [26];
  QChar local_c6;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_c4;
  undefined1 local_c0 [24];
  char local_a8 [56];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  QLatin1StringView local_40;
  undefined1 local_28 [24];
  QUrl local_10;
  long local_8;
  
  fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffd9c >> 0x10);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  slot = this;
  QNetworkAccessBackend::url
            ((QNetworkAccessBackend *)
             CONCAT17(in_stack_fffffffffffffd5f,
                      CONCAT16(in_stack_fffffffffffffd5e,
                               CONCAT15(in_stack_fffffffffffffd5d,
                                        CONCAT14(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58
                                                )))));
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),in_stack_fffffffffffffd4c
            );
  QUrl::host((QFlags_conflict *)local_28);
  local_40 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT17(in_stack_fffffffffffffd5f,
                                         CONCAT16(in_stack_fffffffffffffd5e,
                                                  CONCAT15(in_stack_fffffffffffffd5d,
                                                           CONCAT14(in_stack_fffffffffffffd5c,
                                                                    in_stack_fffffffffffffd58)))),
                        CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  bVar1 = ::operator==((QString *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  QString::~QString((QString *)0x1983dc);
  if ((bVar1 & 1) != 0) {
    QString::QString((QString *)0x1983f3);
    QUrl::setHost((QString *)&local_10,(ParsingMode)local_58);
    QString::~QString((QString *)0x19841a);
  }
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),in_stack_fffffffffffffd4c
            );
  QUrl::host((QFlags_conflict *)local_70);
  bVar2 = QString::isEmpty((QString *)0x198455);
  bVar3 = bVar2 ^ 0xff;
  QString::~QString((QString *)0x198468);
  if ((bVar3 & 1) != 0) {
    QCoreApplication::translate
              (local_a8,"QNetworkAccessFileBackend","Request for opening non-local file %1",0);
    fieldWidth = (int)((ulong)this >> 0x20);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_c4,PrettyDecoded);
    QUrl::toString((QUrlTwoFlags_conflict1 *)local_c0);
    QChar::QChar<char16_t,_true>(&local_c6,L' ');
    QString::arg<QString,_true>
              ((QString *)in_stack_fffffffffffffd70,
               (QString *)CONCAT17(bVar1,in_stack_fffffffffffffd68),fieldWidth,fillChar);
    QNetworkAccessBackend::error
              ((QNetworkAccessBackend *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c,(QString *)0x198516);
    QString::~QString((QString *)0x198523);
    QString::~QString((QString *)0x198530);
    QString::~QString((QString *)0x19853d);
    QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x198547);
    goto LAB_00198b3f;
  }
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),in_stack_fffffffffffffd4c
            );
  QUrl::path((QFlags_conflict *)local_e0);
  bVar4 = QString::isEmpty((QString *)0x19858f);
  QString::~QString((QString *)0x1985a0);
  if ((bVar4 & 1) != 0) {
    QVar9 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffd5d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd5c,
                                                  in_stack_fffffffffffffd58)))),
                       CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    latin1.m_size._4_4_ = in_stack_fffffffffffffd84;
    latin1.m_size._0_4_ = in_stack_fffffffffffffd80;
    latin1.m_data = (char *)QVar9.m_size;
    QString::QString((QString *)this,latin1);
    QUrl::setPath((QString *)&local_10,(ParsingMode)local_100);
    QString::~QString((QString *)0x198603);
  }
  QNetworkAccessBackend::setUrl
            ((QNetworkAccessBackend *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             (QUrl *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_118 = 0xaaaaaaaaaaaaaaaa;
  local_110 = 0xaaaaaaaaaaaaaaaa;
  local_108 = 0xaaaaaaaaaaaaaaaa;
  QUrl::toLocalFile();
  bVar2 = QString::isEmpty((QString *)0x198664);
  if (bVar2) {
    QUrl::scheme();
    local_140 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffd5d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd5c,
                                                  in_stack_fffffffffffffd58)))),
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    in_stack_fffffffffffffd5d =
         ::operator==((QString *)
                      CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffd5d,
                                                             CONCAT14(in_stack_fffffffffffffd5c,
                                                                      in_stack_fffffffffffffd58)))),
                      (QLatin1StringView *)
                      CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    QString::~QString((QString *)0x1986c9);
    if ((in_stack_fffffffffffffd5d & 1) == 0) {
      local_1bc = (int)::operator|(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50);
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
                ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      QUrl::toString((QUrlTwoFlags_conflict1 *)local_1b8);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x1987e5);
    }
    else {
      local_17a = 0x3a;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      QUrl::path((QFlags_conflict *)local_198);
      ::operator+((char16_t *)
                  CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffd5d,
                                                         CONCAT14(in_stack_fffffffffffffd5c,
                                                                  in_stack_fffffffffffffd58)))),
                  (QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x198762);
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x19876f);
      QString::~QString((QString *)0x19877c);
    }
  }
  QFile::setFileName((QString *)&((QNetworkAccessFileBackend *)this)->file);
  OVar6 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)0x198807);
  if ((OVar6 != GetOperation) || (bVar2 = loadFileInfo((QNetworkAccessFileBackend *)this), bVar2)) {
    local_1c0.i = 0xaaaaaaaa;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags((QFlags<QIODeviceBase::OpenModeFlag> *)0x198841);
    OVar6 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)0x19884b);
    if (OVar6 == GetOperation) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      local_1c0.i = local_1c4;
    }
    else {
      if (OVar6 != PutOperation) goto LAB_00198b32;
      local_1c8.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
           (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
           ::operator|(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50);
      local_1c0.i = (Int)local_1c8.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
      QNetworkAccessBackend::createUploadByteDevice
                ((QNetworkAccessBackend *)in_stack_fffffffffffffd70);
      pQVar7 = QNetworkAccessBackend::uploadByteDevice((QNetworkAccessBackend *)0x1988c3);
      QObject::connect((QObject *)&local_1d0,(char *)pQVar7,(QObject *)"2readyRead()",(char *)this,
                       0x3c0145);
      QMetaObject::Connection::~Connection(&local_1d0);
      QMetaObject::invokeMethod<>
                ((QObject *)CONCAT17(bVar1,in_stack_fffffffffffffd68),(char *)this,
                 CONCAT13(bVar3,CONCAT12(bVar4,CONCAT11(in_stack_fffffffffffffd5d,
                                                        in_stack_fffffffffffffd5c))));
    }
    QFlags<QIODeviceBase::OpenModeFlag>::operator|=
              ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_1c0,Unbuffered);
    local_1d4 = local_1c0.i;
    bVar5 = QFile::open((QFlags_conflict *)&((QNetworkAccessFileBackend *)this)->file);
    uVar10 = (bVar5 & 1) << 0x18;
    uVar8 = QFileDevice::isSequential();
    if ((uVar8 & 1) != 0) {
      in_stack_fffffffffffffd70 = QIODevice::readChannelFinished;
      in_stack_fffffffffffffd78 = (QString *)0x0;
      QObject::connect<void(QIODevice::*)(),QNetworkAccessFileBackend::open()::__0>
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffda8,
                 (anon_class_8_1_8991fb9c_for_o *)slot,in_stack_fffffffffffffdf0);
      QMetaObject::Connection::~Connection(&local_1e0);
    }
    if ((uVar10 & 0x1000000) == 0) {
      QCoreApplication::translate(local_218,"QNetworkAccessFileBackend","Error opening %1: %2",0);
      QNetworkAccessBackend::url
                ((QNetworkAccessBackend *)
                 CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffd5d,
                                                        CONCAT14(in_stack_fffffffffffffd5c,OVar6))))
                );
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_23c,PrettyDecoded);
      QUrl::toString((QUrlTwoFlags_conflict1 *)&stack0xfffffffffffffdd0);
      QIODevice::errorString();
      QString::arg<QString,QString>
                (in_stack_fffffffffffffd78,(QString *)in_stack_fffffffffffffd70,
                 (QString *)CONCAT17(bVar1,in_stack_fffffffffffffd68));
      QString::~QString((QString *)0x198a9b);
      QString::~QString((QString *)0x198aa8);
      QUrl::~QUrl(&local_238);
      QString::~QString((QString *)0x198ac2);
      uVar8 = QFile::exists();
      if (((uVar8 & 1) == 0) &&
         (OVar6 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)0x198ade),
         OVar6 != PutOperation)) {
        QNetworkAccessBackend::error
                  ((QNetworkAccessBackend *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd4c,(QString *)0x198b13);
      }
      else {
        QNetworkAccessBackend::error
                  ((QNetworkAccessBackend *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd4c,(QString *)0x198afa);
      }
      QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x198b1d);
      QString::~QString((QString *)0x198b2a);
    }
  }
LAB_00198b32:
  QString::~QString((QString *)0x198b3f);
LAB_00198b3f:
  QUrl::~QUrl(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QNetworkAccessFileBackend::open()
{
    QUrl url = this->url();

    if (url.host() == "localhost"_L1)
        url.setHost(QString());
#if !defined(Q_OS_WIN)
    // do not allow UNC paths on Unix
    if (!url.host().isEmpty()) {
        // we handle only local files
        error(QNetworkReply::ProtocolInvalidOperationError,
              QCoreApplication::translate("QNetworkAccessFileBackend", "Request for opening non-local file %1").arg(url.toString()));
        finished();
        return;
    }
#endif // !defined(Q_OS_WIN)
    if (url.path().isEmpty())
        url.setPath("/"_L1);
    setUrl(url);

    QString fileName = url.toLocalFile();
    if (fileName.isEmpty()) {
        if (url.scheme() == "qrc"_L1) {
            fileName = u':' + url.path();
        } else {
#if defined(Q_OS_ANDROID)
            if (url.scheme() == "assets"_L1)
                fileName = "assets:"_L1 + url.path();
            else
#endif
                fileName = url.toString(QUrl::RemoveAuthority | QUrl::RemoveFragment | QUrl::RemoveQuery);
        }
    }
    file.setFileName(fileName);

    if (operation() == QNetworkAccessManager::GetOperation) {
        if (!loadFileInfo())
            return;
    }

    QIODevice::OpenMode mode;
    switch (operation()) {
    case QNetworkAccessManager::GetOperation:
        mode = QIODevice::ReadOnly;
        break;
    case QNetworkAccessManager::PutOperation:
        mode = QIODevice::WriteOnly | QIODevice::Truncate;
        createUploadByteDevice();
        QObject::connect(uploadByteDevice(), SIGNAL(readyRead()), this, SLOT(uploadReadyReadSlot()));
        QMetaObject::invokeMethod(this, "uploadReadyReadSlot", Qt::QueuedConnection);
        break;
    default:
        Q_ASSERT_X(false, "QNetworkAccessFileBackend::open",
                   "Got a request operation I cannot handle!!");
        return;
    }

    mode |= QIODevice::Unbuffered;
    bool opened = file.open(mode);
    if (file.isSequential())
        connect(&file, &QIODevice::readChannelFinished, this, [this]() { finished(); });

    // could we open the file?
    if (!opened) {
        QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Error opening %1: %2")
                                                .arg(this->url().toString(), file.errorString());

        // why couldn't we open the file?
        // if we're opening for reading, either it doesn't exist, or it's access denied
        // if we're opening for writing, not existing means it's access denied too
        if (file.exists() || operation() == QNetworkAccessManager::PutOperation)
            error(QNetworkReply::ContentAccessDenied, msg);
        else
            error(QNetworkReply::ContentNotFoundError, msg);
        finished();
    }
}